

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_navxythetalat.cpp
# Opt level: O1

int __thiscall
EnvironmentNAVXYTHETALAT::SetStart
          (EnvironmentNAVXYTHETALAT *this,double x_m,double y_m,double theta_rad)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  code *pcVar5;
  long *plVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  uint uVar9;
  int iVar10;
  
  auVar7._8_8_ = y_m;
  auVar7._0_8_ = x_m;
  auVar8._8_8_ = (this->super_EnvironmentNAVXYTHETALATTICE).EnvNAVXYTHETALATCfg.cellsize_m;
  auVar8._0_8_ = (this->super_EnvironmentNAVXYTHETALATTICE).EnvNAVXYTHETALATCfg.cellsize_m;
  auVar8 = divpd(auVar7,auVar8);
  uVar9 = (int)auVar8._0_8_ - (uint)(x_m < 0.0);
  iVar10 = (int)auVar8._8_8_ - (uint)(y_m < 0.0);
  uVar1 = (*(this->super_EnvironmentNAVXYTHETALATTICE).super_DiscreteSpaceInformation.
            _vptr_DiscreteSpaceInformation[0x21])();
  iVar2 = (*(this->super_EnvironmentNAVXYTHETALATTICE).super_DiscreteSpaceInformation.
            _vptr_DiscreteSpaceInformation[0x32])(this,(ulong)uVar9,iVar10);
  iVar3 = -1;
  if ((char)iVar2 != '\0') {
    (*(this->super_EnvironmentNAVXYTHETALATTICE).super_DiscreteSpaceInformation.
      _vptr_DiscreteSpaceInformation[0x2c])(this,(ulong)uVar9,iVar10,(ulong)uVar1);
    pcVar5 = (code *)this->GetHashEntry;
    plVar6 = (long *)((long)&(this->super_EnvironmentNAVXYTHETALATTICE).
                             super_DiscreteSpaceInformation._vptr_DiscreteSpaceInformation +
                     *(long *)&this->field_0x1c8);
    if (((ulong)pcVar5 & 1) != 0) {
      pcVar5 = *(code **)(pcVar5 + *plVar6 + -1);
    }
    piVar4 = (int *)(*pcVar5)(plVar6,uVar9,iVar10,uVar1);
    if (piVar4 == (int *)0x0) {
      pcVar5 = (code *)this->CreateNewHashEntry;
      plVar6 = (long *)((long)&(this->super_EnvironmentNAVXYTHETALATTICE).
                               super_DiscreteSpaceInformation._vptr_DiscreteSpaceInformation +
                       *(long *)&this->field_0x1d8);
      if (((ulong)pcVar5 & 1) != 0) {
        pcVar5 = *(code **)(pcVar5 + *plVar6 + -1);
      }
      piVar4 = (int *)(*pcVar5)(plVar6,uVar9,iVar10,uVar1);
    }
    iVar3 = *piVar4;
    if ((this->super_EnvironmentNAVXYTHETALATTICE).EnvNAVXYTHETALAT.startstateid != iVar3) {
      (this->super_EnvironmentNAVXYTHETALATTICE).bNeedtoRecomputeStartHeuristics = true;
      (this->super_EnvironmentNAVXYTHETALATTICE).bNeedtoRecomputeGoalHeuristics = true;
    }
    (this->super_EnvironmentNAVXYTHETALATTICE).EnvNAVXYTHETALAT.startstateid = iVar3;
    (this->super_EnvironmentNAVXYTHETALATTICE).EnvNAVXYTHETALATCfg.StartX_c = uVar9;
    (this->super_EnvironmentNAVXYTHETALATTICE).EnvNAVXYTHETALATCfg.StartY_c = iVar10;
    (this->super_EnvironmentNAVXYTHETALATTICE).EnvNAVXYTHETALATCfg.StartTheta = uVar1;
  }
  return iVar3;
}

Assistant:

int EnvironmentNAVXYTHETALAT::SetStart(double x_m, double y_m, double theta_rad)
{
    int x = CONTXY2DISC(x_m, EnvNAVXYTHETALATCfg.cellsize_m);
    int y = CONTXY2DISC(y_m, EnvNAVXYTHETALATCfg.cellsize_m);
    int theta = ContTheta2DiscNew(theta_rad);

    if (!IsWithinMapCell(x, y)) {
        SBPL_ERROR("ERROR: trying to set a start cell %d %d that is outside of map\n", x, y);
        return -1;
    }

    SBPL_PRINTF("env: setting start to %.3f %.3f %.3f (%d %d %d)\n", x_m, y_m, theta_rad, x, y, theta);

    if (!IsValidConfiguration(x, y, theta)) {
        SBPL_PRINTF("WARNING: start configuration %d %d %d is invalid\n", x, y, theta);
    }

    EnvNAVXYTHETALATHashEntry_t* OutHashEntry;
    if ((OutHashEntry = (this->*GetHashEntry)(x, y, theta)) == NULL) {
        // have to create a new entry
        OutHashEntry = (this->*CreateNewHashEntry)(x, y, theta);
    }

    // need to recompute start heuristics?
    if (EnvNAVXYTHETALAT.startstateid != OutHashEntry->stateID) {
        bNeedtoRecomputeStartHeuristics = true;
        // because termination condition can be not all states TODO - make it dependent on term. condition
        bNeedtoRecomputeGoalHeuristics = true;
    }

    // set start
    EnvNAVXYTHETALAT.startstateid = OutHashEntry->stateID;
    EnvNAVXYTHETALATCfg.StartX_c = x;
    EnvNAVXYTHETALATCfg.StartY_c = y;
    EnvNAVXYTHETALATCfg.StartTheta = theta;

    return EnvNAVXYTHETALAT.startstateid;
}